

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O0

void __thiscall
AssemblyCode::AddRegConstCommand::AddRegConstCommand
          (AddRegConstCommand *this,CTemp *leftOperand,int constant)

{
  int constant_local;
  CTemp *leftOperand_local;
  AddRegConstCommand *this_local;
  
  AssemblyCommand::AssemblyCommand(&this->super_AssemblyCommand);
  (this->super_AssemblyCommand)._vptr_AssemblyCommand = (_func_int **)&PTR_GetIn_00239eb8;
  IRT::CTemp::CTemp(&this->leftOperand,leftOperand);
  this->constant = constant;
  return;
}

Assistant:

AssemblyCode::AddRegConstCommand::AddRegConstCommand( const IRT::CTemp leftOperand, int constant ) : leftOperand(
        leftOperand ), constant( constant ) { }